

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_hash_dictionary_handler.c
# Opt level: O3

ion_err_t oadict_scan(ion_oadict_cursor_t *cursor)

{
  ion_dictionary_parent_t *piVar1;
  ion_boolean_t iVar2;
  int iVar3;
  ion_key_type_t iVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  
  piVar1 = ((cursor->super).dictionary)->instance;
  iVar4 = piVar1[1].key_type;
  uVar7 = (long)(cursor->current + 1) % (long)(int)iVar4;
  iVar3 = cursor->first;
  if ((int)uVar7 != iVar3) {
    uVar7 = uVar7 & 0xffffffff;
    do {
      iVar6 = (int)uVar7;
      lVar5 = (long)(((piVar1->record).key_size + (piVar1->record).value_size + 1) * iVar6);
      if ((byte)piVar1[1].compare[lVar5] < 0xfe) {
        iVar2 = test_predicate(&cursor->super,piVar1[1].compare + lVar5 + 1);
        if (iVar2 == '\x01') {
          cursor->current = iVar6;
          return '\x04';
        }
        iVar4 = piVar1[1].key_type;
        iVar3 = cursor->first;
      }
      uVar7 = (ulong)(iVar6 + 1U);
      if ((int)iVar4 <= (int)(iVar6 + 1U)) {
        uVar7 = 0;
      }
    } while ((int)uVar7 != iVar3);
  }
  return '\x01';
}

Assistant:

ion_err_t
oadict_scan(
	ion_oadict_cursor_t *cursor	/* don't need to pass in the cursor */
) {
	/* need to scan hashmap fully looking for values that satisfy - need to think about */
	ion_hashmap_t *hash_map = (ion_hashmap_t *) (cursor->super.dictionary->instance);

	int loc					= (cursor->current + 1) % hash_map->map_size;

	/* this is the current position of the cursor */
	/* and start scanning 1 ahead */

	/* start at the current position, scan forward */
	while (loc != cursor->first) {
		/* check to see if current item is a match based on key */
		/* locate first item */
		ion_hash_bucket_t *item = (((ion_hash_bucket_t *) ((hash_map->entry + (hash_map->super.record.key_size + hash_map->super.record.value_size + SIZEOF(STATUS)) * loc))));

		if ((item->status == ION_EMPTY) || (item->status == ION_DELETED)) {
			/* if empty, just skip to next cell */
			loc++;
		}
		else {
			/* check to see if the current key value satisfies the predicate */

			ion_boolean_t key_satisfies_predicate = test_predicate(&(cursor->super), item->data);	/* assumes that the key is first */

			if (key_satisfies_predicate == boolean_true) {
				cursor->current = loc;	/* this is the next index for value */
				return cs_cursor_active;
			}

			/* If valid bucket is not found, advance current position. */
			loc++;
		}

		if (loc >= hash_map->map_size) {
			/* Perform wrapping */
			loc = 0;
		}
	}

	/* if you end up here, you've wrapped the entire data structure and not found a value */
	return cs_end_of_results;
}